

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O1

int template_enter(void *closure,char *name)

{
  int iVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  __n = strlen(name);
  iVar3 = strncmp("roas",name,__n);
  if (iVar3 == 0) {
    *(undefined1 *)closure = 1;
    *(undefined4 *)((long)closure + 4) = 0;
    iVar3 = 1;
  }
  else {
    iVar1 = *(int *)((long)closure + 4);
    if (iVar1 != 0) {
      iVar3 = strcmp("last",name);
      if ((iVar3 == 0) && (iVar3 = 1, iVar1 == *(int *)(*(long *)((long)closure + 8) + 0x108) + -1))
      goto LAB_0010381d;
    }
    iVar3 = 0;
  }
LAB_0010381d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int template_enter(void *closure, const char *name)
{
	struct exporter_state *state = closure;

	if (strncmp("roas", name, strlen(name)) == 0) {
		state->roa_section = true;
		state->current_roa = 0;

		return 1;

	} else if (state->current_roa && strcmp("last", name) == 0 &&
		   state->current_roa == tommy_array_size(state->roas) - 1) {
		return 1;
	}

	return 0;
}